

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestDiscretizedArcLength.cpp
# Opt level: O2

bool ParseDiscretizedArcLength(string *sString)

{
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __a;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  bool bVar5;
  int iVar6;
  size_t sVar7;
  ostream *poVar8;
  undefined4 local_418;
  string_type local_408;
  double local_3e8;
  string sComputedArcLength;
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  local_3c0;
  string sRxPat;
  string sDirectComputedArcLength;
  string sTestId;
  char szBuffer [20];
  string sDirection;
  string sEndAz;
  string sStartAz;
  string sArcRadius;
  string sArcCenterLong;
  string sArcCenterLat;
  string local_188;
  string local_168;
  string local_148;
  string local_128;
  regex pat;
  string sDifference;
  int sub_matches [10];
  sregex_token_iterator s_end;
  
  trim(sString," \t\n\r\f\v");
  sTestId._M_dataplus._M_p = (pointer)&sTestId.field_2;
  sTestId._M_string_length = 0;
  sTestId.field_2._M_local_buf[0] = '\0';
  sArcCenterLat._M_dataplus._M_p = (pointer)&sArcCenterLat.field_2;
  sArcCenterLat._M_string_length = 0;
  sArcCenterLong._M_dataplus._M_p = (pointer)&sArcCenterLong.field_2;
  sArcCenterLong._M_string_length = 0;
  sArcCenterLat.field_2._M_local_buf[0] = '\0';
  sArcCenterLong.field_2._M_local_buf[0] = '\0';
  sArcRadius._M_dataplus._M_p = (pointer)&sArcRadius.field_2;
  sArcRadius._M_string_length = 0;
  sStartAz._M_dataplus._M_p = (pointer)&sStartAz.field_2;
  sStartAz._M_string_length = 0;
  sArcRadius.field_2._M_local_buf[0] = '\0';
  sStartAz.field_2._M_local_buf[0] = '\0';
  sEndAz._M_dataplus._M_p = (pointer)&sEndAz.field_2;
  sEndAz._M_string_length = 0;
  sDirection._M_dataplus._M_p = (pointer)&sDirection.field_2;
  sDirection._M_string_length = 0;
  sEndAz.field_2._M_local_buf[0] = '\0';
  sDirection.field_2._M_local_buf[0] = '\0';
  sComputedArcLength._M_dataplus._M_p = (pointer)&sComputedArcLength.field_2;
  sComputedArcLength._M_string_length = 0;
  sDirectComputedArcLength._M_dataplus._M_p = (pointer)&sDirectComputedArcLength.field_2;
  sDirectComputedArcLength._M_string_length = 0;
  sComputedArcLength.field_2._M_local_buf[0] = '\0';
  sDirectComputedArcLength.field_2._M_local_buf[0] = '\0';
  sDifference._M_dataplus._M_p = (pointer)&sDifference.field_2;
  sDifference._M_string_length = 0;
  sDifference.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&sRxPat,"([a-z]*|[A-Z]*\\d*)[,]",(allocator *)szBuffer);
  std::__cxx11::string::append((char *)&sRxPat);
  std::__cxx11::string::append((char *)&sRxPat);
  std::__cxx11::string::append((char *)&sRxPat);
  std::__cxx11::string::append((char *)&sRxPat);
  std::__cxx11::string::append((char *)&sRxPat);
  std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
  basic_regex<std::char_traits<char>,std::allocator<char>>
            ((basic_regex<char,std::__cxx11::regex_traits<char>> *)&pat,&sRxPat,0x11);
  sub_matches[4] = 5;
  sub_matches[5] = 6;
  sub_matches[6] = 7;
  sub_matches[7] = 8;
  sub_matches[0] = 1;
  sub_matches[1] = 2;
  sub_matches[2] = 3;
  sub_matches[3] = 4;
  sub_matches[8] = 9;
  sub_matches[9] = 10;
  __a._M_current = (sString->_M_dataplus)._M_p;
  std::__cxx11::
  regex_token_iterator<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char,std::__cxx11::regex_traits<char>>
  ::regex_token_iterator<10ul>
            ((regex_token_iterator<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char,std::__cxx11::regex_traits<char>>
              *)szBuffer,__a,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(__a._M_current + sString->_M_string_length),&pat,&sub_matches,0);
  s_end._M_suffix.
  super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .second._M_current._0_1_ = 0;
  s_end._M_suffix._9_8_ = 0;
  s_end._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  s_end._M_suffix.
  super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .first._M_current._0_1_ = 0;
  s_end._M_suffix.
  super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .first._M_current._1_7_ = 0;
  s_end._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  s_end._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  s_end._M_position._M_match.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  s_end._M_position._M_match._M_begin._M_current = (char *)0x0;
  s_end._M_position._M_match.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  s_end._M_position._M_match.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  s_end._M_position._M_pregex = (regex_type *)0x0;
  s_end._M_position._M_flags = 0;
  s_end._M_position._28_4_ = 0;
  s_end._M_position._M_begin._M_current = (char *)0x0;
  s_end._M_position._M_end._M_current = (char *)0x0;
  s_end._M_n = 0;
  s_end._M_result = (value_type *)0x0;
  s_end._M_has_m1 = false;
  bVar5 = std::__cxx11::
          regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
          ::operator!=((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                        *)szBuffer,&s_end);
  if (bVar5) {
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++(&local_3c0,
                 (regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)szBuffer,0);
    std::__cxx11::
    sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::str(&local_408,local_3c0._M_result);
    std::__cxx11::string::operator=((string *)&sTestId,(string *)&local_408);
    std::__cxx11::string::~string((string *)&local_408);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator(&local_3c0);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++(&local_3c0,
                 (regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)szBuffer,0);
    std::__cxx11::
    sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::str(&local_408,local_3c0._M_result);
    std::__cxx11::string::operator=((string *)&sArcCenterLat,(string *)&local_408);
    std::__cxx11::string::~string((string *)&local_408);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator(&local_3c0);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++(&local_3c0,
                 (regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)szBuffer,0);
    std::__cxx11::
    sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::str(&local_408,local_3c0._M_result);
    std::__cxx11::string::operator=((string *)&sArcCenterLong,(string *)&local_408);
    std::__cxx11::string::~string((string *)&local_408);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator(&local_3c0);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++(&local_3c0,
                 (regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)szBuffer,0);
    std::__cxx11::
    sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::str(&local_408,local_3c0._M_result);
    std::__cxx11::string::operator=((string *)&sArcRadius,(string *)&local_408);
    std::__cxx11::string::~string((string *)&local_408);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator(&local_3c0);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++(&local_3c0,
                 (regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)szBuffer,0);
    std::__cxx11::
    sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::str(&local_408,local_3c0._M_result);
    std::__cxx11::string::operator=((string *)&sStartAz,(string *)&local_408);
    std::__cxx11::string::~string((string *)&local_408);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator(&local_3c0);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++(&local_3c0,
                 (regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)szBuffer,0);
    std::__cxx11::
    sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::str(&local_408,local_3c0._M_result);
    std::__cxx11::string::operator=((string *)&sEndAz,(string *)&local_408);
    std::__cxx11::string::~string((string *)&local_408);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator(&local_3c0);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++(&local_3c0,
                 (regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)szBuffer,0);
    std::__cxx11::
    sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::str(&local_408,local_3c0._M_result);
    std::__cxx11::string::operator=((string *)&sDirection,(string *)&local_408);
    std::__cxx11::string::~string((string *)&local_408);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator(&local_3c0);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++(&local_3c0,
                 (regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)szBuffer,0);
    std::__cxx11::
    sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::str(&local_408,local_3c0._M_result);
    std::__cxx11::string::operator=((string *)&sComputedArcLength,(string *)&local_408);
    std::__cxx11::string::~string((string *)&local_408);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator(&local_3c0);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++(&local_3c0,
                 (regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)szBuffer,0);
    std::__cxx11::
    sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::str(&local_408,local_3c0._M_result);
    std::__cxx11::string::operator=((string *)&sDirectComputedArcLength,(string *)&local_408);
    std::__cxx11::string::~string((string *)&local_408);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator(&local_3c0);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++(&local_3c0,
                 (regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)szBuffer,0);
    std::__cxx11::
    sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::str(&local_408,local_3c0._M_result);
    std::__cxx11::string::operator=((string *)&sDifference,(string *)&local_408);
    std::__cxx11::string::~string((string *)&local_408);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator(&local_3c0);
  }
  std::__cxx11::
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  ::~regex_token_iterator(&s_end);
  std::__cxx11::
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  ::~regex_token_iterator
            ((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
              *)szBuffer);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&pat);
  std::__cxx11::string::~string((string *)&sRxPat);
  std::__cxx11::string::string((string *)&local_128,(string *)&sArcCenterLat);
  dVar1 = ParseLatitude(&local_128);
  std::__cxx11::string::string((string *)&local_148,(string *)&sArcCenterLong);
  dVar2 = ParseLongitude(&local_148);
  szBuffer._0_8_ = dVar1 * 0.017453292519943295;
  szBuffer._8_8_ = dVar2 * 0.017453292519943295;
  dVar1 = atof(sArcRadius._M_dataplus._M_p);
  dVar2 = atof(sStartAz._M_dataplus._M_p);
  local_3e8 = atof(sEndAz._M_dataplus._M_p);
  local_3e8 = local_3e8 * 0.017453292519943295;
  iVar6 = atoi(sDirection._M_dataplus._M_p);
  dVar1 = GeoCalcs::DiscretizedArcLength
                    ((LLPoint *)szBuffer,dVar1 * 1852.0,dVar2 * 0.017453292519943295,local_3e8,iVar6
                     ,0x10,1e-09);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::string((string *)&local_168,(string *)&sArcCenterLat);
  dVar2 = ParseLatitude(&local_168);
  std::__cxx11::string::string((string *)&local_188,(string *)&sArcCenterLong);
  dVar3 = ParseLongitude(&local_188);
  szBuffer._0_8_ = dVar2 * 0.017453292519943295;
  szBuffer._8_8_ = dVar3 * 0.017453292519943295;
  dVar2 = atof(sArcRadius._M_dataplus._M_p);
  local_3e8 = atof(sStartAz._M_dataplus._M_p);
  local_3e8 = local_3e8 * 0.017453292519943295;
  dVar3 = atof(sEndAz._M_dataplus._M_p);
  iVar6 = atoi(sDirection._M_dataplus._M_p);
  dVar2 = GeoCalcs::DirectArcLength
                    ((LLPoint *)szBuffer,dVar2 * 1852.0,local_3e8,dVar3 * 0.017453292519943295,iVar6
                     ,1e-09);
  dVar1 = dVar1 * 0.0005399568034557236;
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&local_168);
  bVar5 = true;
  local_418 = SUB84(dVar1,0);
  sprintf(szBuffer,"%07.6f",local_418);
  iVar6 = std::__cxx11::string::compare((char *)&sComputedArcLength);
  if (iVar6 != 0) {
    sVar7 = strlen(szBuffer);
    if (szBuffer[sVar7 - 1] == '0') {
      szBuffer[sVar7 - 1] = '\0';
    }
    iVar6 = std::__cxx11::string::compare((char *)&sComputedArcLength);
    if (iVar6 != 0) {
      dVar3 = atof(sComputedArcLength._M_dataplus._M_p);
      dVar4 = ABS(dVar3);
      if (ABS(dVar1) <= ABS(dVar3)) {
        dVar4 = ABS(dVar1);
      }
      if (ABS(dVar1 - dVar3) <= dVar4 * 5e-09) {
        poVar8 = std::operator<<((ostream *)&std::cout,"\n");
        poVar8 = std::operator<<(poVar8,(string *)&sTestId);
        poVar8 = std::operator<<(poVar8,
                                 " within rounding tolerance of 0.5e-8: Input Computed Arc Length: "
                                );
        poVar8 = std::operator<<(poVar8,(string *)&sComputedArcLength);
        poVar8 = std::operator<<(poVar8,"  calced: ");
        std::operator<<(poVar8,szBuffer);
      }
      else {
        poVar8 = std::operator<<((ostream *)&std::cout,"\n");
        poVar8 = std::operator<<(poVar8,(string *)&sTestId);
        poVar8 = std::operator<<(poVar8," failed: Expected Computed Arc Length: ");
        poVar8 = std::operator<<(poVar8,(string *)&sComputedArcLength);
        poVar8 = std::operator<<(poVar8,"  calced: ");
        std::operator<<(poVar8,szBuffer);
        bVar5 = false;
      }
    }
  }
  sprintf(szBuffer,"%07.6f",SUB84(dVar2 * 0.0005399568034557236,0));
  iVar6 = std::__cxx11::string::compare((char *)&sDirectComputedArcLength);
  if (iVar6 != 0) {
    sVar7 = strlen(szBuffer);
    if (szBuffer[sVar7 - 1] == '0') {
      szBuffer[sVar7 - 1] = '\0';
    }
    iVar6 = std::__cxx11::string::compare((char *)&sDirectComputedArcLength);
    if (iVar6 != 0) {
      dVar2 = atof(sComputedArcLength._M_dataplus._M_p);
      dVar3 = ABS(dVar2);
      if (ABS(dVar1) <= ABS(dVar2)) {
        dVar3 = ABS(dVar1);
      }
      if (ABS(dVar1 - dVar2) <= dVar3 * 5e-09) {
        poVar8 = std::operator<<((ostream *)&std::cout,"\n");
        poVar8 = std::operator<<(poVar8,(string *)&sTestId);
        poVar8 = std::operator<<(poVar8,
                                 " within rounding tolerance of 0.5e-8: Input Direct Computed Arc Length: "
                                );
        poVar8 = std::operator<<(poVar8,(string *)&sDirectComputedArcLength);
        poVar8 = std::operator<<(poVar8,"  calced: ");
        std::operator<<(poVar8,szBuffer);
      }
      else {
        poVar8 = std::operator<<((ostream *)&std::cout,"\n");
        poVar8 = std::operator<<(poVar8,(string *)&sTestId);
        poVar8 = std::operator<<(poVar8," failed: Expected Direct Computed Arc Length: ");
        poVar8 = std::operator<<(poVar8,(string *)&sDirectComputedArcLength);
        poVar8 = std::operator<<(poVar8,"  calced: ");
        std::operator<<(poVar8,szBuffer);
        bVar5 = false;
      }
    }
  }
  std::__cxx11::string::~string((string *)&sDifference);
  std::__cxx11::string::~string((string *)&sDirectComputedArcLength);
  std::__cxx11::string::~string((string *)&sComputedArcLength);
  std::__cxx11::string::~string((string *)&sDirection);
  std::__cxx11::string::~string((string *)&sEndAz);
  std::__cxx11::string::~string((string *)&sStartAz);
  std::__cxx11::string::~string((string *)&sArcRadius);
  std::__cxx11::string::~string((string *)&sArcCenterLong);
  std::__cxx11::string::~string((string *)&sArcCenterLat);
  std::__cxx11::string::~string((string *)&sTestId);
  return bVar5;
}

Assistant:

bool ParseDiscretizedArcLength(string sString)
{
    bool bPassed = true;
    trim(sString);
    string sTestId, sArcCenterLat, sArcCenterLong, sArcRadius;
    string sStartAz, sEndAz, sDirection, sComputedArcLength;
    string sDirectComputedArcLength, sDifference;

    try
    {
        regex_constants::syntax_option_type flags = regex_constants::icase | regex_constants::ECMAScript;

        string sRxPat = "([a-z]*|[A-Z]*\\d*)[,]";
        sRxPat += "([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[NS])[,]([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[WE])[,]";
        sRxPat += "([-+]?[0-9]*[.]?[0-9]+)[,]([-+]?[0-9]*[.]?[0-9]+)[,]([-+]?[0-9]*[.]?[0-9]+)[,]";
        sRxPat += "([-+]?[1])[,]";
        sRxPat += "([-+]?[0-9]*[.]?[0-9]+)[,]([-+]?[0-9]*[.]?[0-9]+)[,]";
        sRxPat += "(.*)";
        regex pat(sRxPat, flags);
        int const sub_matches[] = {1, 2, 3, 4, 5, 6, 7, 8, 9, 10,};
        sregex_token_iterator it(sString.begin(), sString.end(), pat, sub_matches);
        sregex_token_iterator s_end;
        if (it != s_end)
        {
            sTestId = *it++;
            sArcCenterLat = *it++;
            sArcCenterLong = *it++;
            sArcRadius = *it++;
            sStartAz = *it++;
            sEndAz = *it++;
            sDirection = *it++;
            sComputedArcLength = *it++;
            sDirectComputedArcLength = *it++;
            sDifference = *it++;
        }
    }
    catch (regex_error &e)
    {
        cout << "\n" << e.what();
        return false;
    }


    int nSegments = 16;
    double dDist1 = DiscretizedArcLength(
            LLPoint(Deg2Rad(ParseLatitude(sArcCenterLat)), Deg2Rad(ParseLongitude(sArcCenterLong))),
            NmToMeters(atof(sArcRadius.c_str())), Deg2Rad(atof(sStartAz.c_str())), Deg2Rad(atof(sEndAz.c_str())),
            atoi(sDirection.c_str()), nSegments, kTol);
    dDist1 = MetersToNm(dDist1);


    double dDist2 = DirectArcLength(
            LLPoint(Deg2Rad(ParseLatitude(sArcCenterLat)), Deg2Rad(ParseLongitude(sArcCenterLong))),
            NmToMeters(atof(sArcRadius.c_str())), Deg2Rad(atof(sStartAz.c_str())), Deg2Rad(atof(sEndAz.c_str())),
            atoi(sDirection.c_str()), kTol);
    dDist2 = MetersToNm(dDist2);

    //  double dError = dDist2 - dDist1;

    char szBuffer[20];
    sprintf(szBuffer, "%07.6f", dDist1);
    if (sComputedArcLength.compare(szBuffer) != 0)
    {
        if (szBuffer[strlen(szBuffer) - 1] == '0')
        {
            szBuffer[strlen(szBuffer) - 1] = '\0';
        }
        if (sComputedArcLength.compare(szBuffer) != 0)
        {
            if (IsApprox(dDist1, atof(sComputedArcLength.c_str()), 0.5e-8))
            {
                cout << "\n" << sTestId << " within rounding tolerance of 0.5e-8: Input Computed Arc Length: " <<
                sComputedArcLength << "  calced: " << szBuffer;
            }
            else
            {
                cout << "\n" << sTestId << " failed: Expected Computed Arc Length: " << sComputedArcLength <<
                "  calced: " << szBuffer;
                bPassed = false;
            }
        }

    }

    sprintf(szBuffer, "%07.6f", dDist2);
    if (sDirectComputedArcLength.compare(szBuffer) != 0)
    {
        if (szBuffer[strlen(szBuffer) - 1] == '0')
        {
            szBuffer[strlen(szBuffer) - 1] = '\0';
        }
        if (sDirectComputedArcLength.compare(szBuffer) != 0)
        {
            if (IsApprox(dDist1, atof(sComputedArcLength.c_str()), 0.5e-8))
            {
                cout << "\n" << sTestId << " within rounding tolerance of 0.5e-8: Input Direct Computed Arc Length: " <<
                sDirectComputedArcLength << "  calced: " << szBuffer;
            }
            else
            {
                cout << "\n" << sTestId << " failed: Expected Direct Computed Arc Length: " <<
                sDirectComputedArcLength << "  calced: " << szBuffer;
                bPassed = false;
            }
        }
    }
    return bPassed;
}